

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::TableUpdateLayout(ImGuiTable *table)

{
  ImSpan<signed_char> *this;
  ImSpan<ImGuiTableColumn> *this_00;
  float fVar1;
  byte bVar2;
  ImU8 IVar3;
  ImGuiWindow *pIVar4;
  float fVar5;
  ImVec2 IVar6;
  ImGuiContext *pIVar7;
  char cVar8;
  bool bVar9;
  bool bVar10;
  ImGuiID id;
  byte *pbVar11;
  ImGuiTableColumn *pIVar12;
  ImGuiTableColumn *pIVar13;
  char *pcVar14;
  uint uVar15;
  ImGuiTableColumnIdx IVar16;
  bool bVar17;
  int i;
  ulong uVar18;
  int column_n;
  int i_00;
  ulong uVar19;
  char cVar20;
  int column_n_1;
  int iVar21;
  bool bVar22;
  uint uVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float local_d0;
  float local_cc;
  float local_c8;
  ImRect host_clip_rect;
  ImRect local_40;
  
  pIVar7 = GImGui;
  if (table->IsLayoutLocked != false) {
    __assert_fail("table->IsLayoutLocked == false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_tables.cpp"
                  ,0x2a2,"void ImGui::TableUpdateLayout(ImGuiTable *)");
  }
  uVar15 = table->Flags & 0xe000;
  table->IsDefaultDisplayOrder = true;
  table->ColumnsEnabledCount = '\0';
  table->EnabledMaskByDisplayOrder = 0;
  table->EnabledMaskByIndex = 0;
  fVar27 = (pIVar7->Style).FramePadding.x;
  fVar24 = 1.0;
  if (1.0 <= fVar27) {
    fVar24 = fVar27;
  }
  table->MinColumnWidth = fVar24;
  this = &table->DisplayOrderToIndex;
  this_00 = &table->Columns;
  iVar21 = -1;
  i = 0;
  fVar27 = 0.0;
  local_cc = 0.0;
  bVar10 = false;
  bVar17 = false;
  local_d0 = 0.0;
  cVar8 = '\0';
  while( true ) {
    uVar23 = table->ColumnsCount;
    cVar20 = (char)iVar21;
    if ((int)uVar23 <= i) break;
    pbVar11 = (byte *)ImSpan<signed_char>::operator[](this,i);
    bVar2 = *pbVar11;
    i_00 = (int)(char)bVar2;
    if (i != i_00) {
      table->IsDefaultDisplayOrder = false;
    }
    pIVar12 = ImSpan<ImGuiTableColumn>::operator[](this_00,i_00);
    if (table->DeclColumnsCount <= (char)bVar2) {
      TableSetupColumnFlags(table,pIVar12,0);
      pIVar12->NameOffset = -1;
      pIVar12->UserID = 0;
      pIVar12->InitStretchWeightOrWidth = -1.0;
    }
    uVar23 = table->Flags;
    if (((uVar23 & 4) == 0) || ((pIVar12->Flags & 0x80) != 0)) {
      pIVar12->IsEnabledNextFrame = true;
      bVar9 = true;
    }
    else {
      bVar9 = pIVar12->IsEnabledNextFrame;
    }
    if (pIVar12->IsEnabled == bVar9) {
      IVar16 = pIVar12->SortOrder;
    }
    else {
      pIVar12->IsEnabled = bVar9;
      table->IsSettingsDirty = true;
      IVar16 = pIVar12->SortOrder;
      if (IVar16 != -1 && (bVar9 & 1U) == 0) {
        table->IsSortSpecsDirty = true;
      }
    }
    if (((uVar23 >> 0x19 & 1) == 0) && ('\0' < IVar16)) {
      table->IsSortSpecsDirty = true;
    }
    if ((&pIVar12->WidthRequest)[(ulong)((pIVar12->Flags & 8) == 0) * 2] <= 0.0 &&
        (&pIVar12->WidthRequest)[(ulong)((pIVar12->Flags & 8) == 0) * 2] != 0.0) {
      pIVar12->AutoFitQueue = '\a';
      pIVar12->CannotSkipItemsQueue = '\a';
    }
    if ((bVar9 & 1U) == 0) {
      pIVar12->IndexWithinEnabledSet = -1;
    }
    else {
      pIVar12->PrevEnabledColumn = cVar20;
      pIVar12->NextEnabledColumn = -1;
      if (iVar21 != -1) {
        pIVar13 = ImSpan<ImGuiTableColumn>::operator[](this_00,iVar21);
        pIVar13->NextEnabledColumn = bVar2;
      }
      cVar20 = table->ColumnsEnabledCount;
      table->ColumnsEnabledCount = cVar20 + '\x01';
      pIVar12->IndexWithinEnabledSet = cVar20;
      table->EnabledMaskByIndex = table->EnabledMaskByIndex | 1L << (bVar2 & 0x3f);
      bVar2 = pIVar12->DisplayOrder;
      table->EnabledMaskByDisplayOrder = table->EnabledMaskByDisplayOrder | 1L << (bVar2 & 0x3f);
      if ((char)bVar2 < cVar20) {
        __assert_fail("column->IndexWithinEnabledSet <= column->DisplayOrder",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_tables.cpp"
                      ,0x2e7,"void ImGui::TableUpdateLayout(ImGuiTable *)");
      }
      if (pIVar12->IsPreserveWidthAuto == false) {
        fVar24 = TableGetColumnWidthAuto(table,pIVar12);
        pIVar12->WidthAuto = fVar24;
      }
      uVar23 = pIVar12->Flags;
      if ((uVar23 & 0x20) == 0) {
        bVar10 = true;
      }
      if ((((uVar23 & 8) != 0) && ((uVar23 & 0x20) != 0)) &&
         (0.0 < pIVar12->InitStretchWeightOrWidth)) {
        pIVar12->WidthAuto = pIVar12->InitStretchWeightOrWidth;
      }
      bVar17 = (bool)(bVar17 | pIVar12->AutoFitQueue != '\0');
      fVar24 = pIVar12->WidthAuto;
      iVar21 = i_00;
      if ((uVar23 & 4) == 0) {
        fVar27 = (float)((uint)fVar27 & -(uint)(fVar24 <= fVar27) |
                        ~-(uint)(fVar24 <= fVar27) & (uint)fVar24);
        cVar8 = cVar8 + '\x01';
      }
      else {
        local_cc = local_cc + fVar24;
        local_d0 = (float)((int)local_d0 + 1);
      }
    }
    i = i + 1;
  }
  if ((((table->Flags & 8U) != 0) && (((uint)table->Flags >> 0x1a & 1) == 0)) &&
     (table->SortSpecsCount == '\0')) {
    table->IsSortSpecsDirty = true;
  }
  table->RightMostEnabledColumn = cVar20;
  if (cVar20 < '\0') {
    __assert_fail("table->RightMostEnabledColumn >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_tables.cpp"
                  ,0x305,"void ImGui::TableUpdateLayout(ImGuiTable *)");
  }
  if (bVar17) {
    if (table->OuterWindow != table->InnerWindow) {
      table->InnerWindow->SkipItems = false;
    }
    table->IsSettingsDirty = true;
  }
  table->LeftMostStretchedColumn = -1;
  table->RightMostStretchedColumn = -1;
  fVar25 = (float)(int)local_d0;
  local_d0 = 0.0;
  fVar24 = 0.0;
  for (uVar19 = 0; (long)uVar19 < (long)(int)uVar23; uVar19 = uVar19 + 1) {
    bVar2 = (byte)uVar19;
    if ((table->EnabledMaskByIndex >> (uVar19 & 0x3f) & 1) != 0) {
      pIVar12 = ImSpan<ImGuiTableColumn>::operator[](this_00,(int)uVar19);
      uVar23 = pIVar12->Flags;
      if ((uVar23 & 8) == 0) {
        if ((((uVar23 & 0x20) != 0) || (pIVar12->AutoFitQueue != '\0')) ||
           (fVar26 = pIVar12->StretchWeight, fVar26 < 0.0)) {
          if (uVar15 == 0x6000) {
            fVar26 = (pIVar12->WidthAuto / local_cc) * fVar25;
          }
          else {
            fVar26 = 1.0;
          }
          uVar23 = -(uint)(0.0 < pIVar12->InitStretchWeightOrWidth);
          fVar26 = (float)(uVar23 & (uint)pIVar12->InitStretchWeightOrWidth | ~uVar23 & (uint)fVar26
                          );
          pIVar12->StretchWeight = fVar26;
        }
        if ((table->LeftMostStretchedColumn == -1) ||
           (pIVar13 = ImSpan<ImGuiTableColumn>::operator[]
                                (this_00,(int)table->LeftMostStretchedColumn),
           pIVar12->DisplayOrder < pIVar13->DisplayOrder)) {
          table->LeftMostStretchedColumn = bVar2;
        }
        local_d0 = local_d0 + fVar26;
        if ((table->RightMostStretchedColumn == -1) ||
           (pIVar13 = ImSpan<ImGuiTableColumn>::operator[]
                                (this_00,(int)table->RightMostStretchedColumn),
           pIVar13->DisplayOrder < pIVar12->DisplayOrder)) {
          table->RightMostStretchedColumn = bVar2;
        }
      }
      else {
        IVar3 = pIVar12->AutoFitQueue;
        if (uVar15 == 0x4000) {
          fVar26 = fVar27;
          if ((uVar23 & 0x20) != 0 || IVar3 != '\0') goto LAB_00185c2b;
        }
        else {
          fVar26 = pIVar12->WidthAuto;
LAB_00185c2b:
          if (IVar3 == '\0') {
            if (((uVar23 & 0x20) != 0) &&
               ((table->RequestOutputMaskByIndex & 1L << (bVar2 & 0x3f)) != 0)) {
              pIVar12->WidthRequest = fVar26;
            }
          }
          else {
            pIVar12->WidthRequest = fVar26;
            if (((IVar3 != '\x01') && (table->IsInitializing == true)) &&
               (pIVar12->IsPreserveWidthAuto == false)) {
              fVar28 = table->MinColumnWidth * 4.0;
              uVar23 = -(uint)(fVar28 <= fVar26);
              pIVar12->WidthRequest = (float)(~uVar23 & (uint)fVar28 | (uint)fVar26 & uVar23);
            }
          }
        }
        fVar24 = fVar24 + pIVar12->WidthRequest;
      }
      pIVar12->IsPreserveWidthAuto = false;
      fVar24 = fVar24 + table->CellPaddingX + table->CellPaddingX;
      uVar23 = table->ColumnsCount;
    }
  }
  table->ColumnsEnabledFixedCount = cVar8;
  fVar27 = (table->WorkRect).Min.x;
  fVar25 = table->OuterPaddingX + table->OuterPaddingX +
           (float)(table->ColumnsEnabledCount + -1) * (table->CellSpacingX1 + table->CellSpacingX2);
  if ((((table->Flags & 0x800000) == 0) || (table->InnerWidth != 0.0)) || (NAN(table->InnerWidth)))
  {
    fVar26 = (table->WorkRect).Max.x - fVar27;
  }
  else {
    fVar26 = (table->InnerClipRect).Max.x - (table->InnerClipRect).Min.x;
  }
  fVar28 = (table->WorkRect).Min.y;
  fVar24 = (fVar26 - fVar25) - fVar24;
  table->ColumnsGivenWidth =
       (float)(int)table->ColumnsEnabledCount * (table->CellPaddingX + table->CellPaddingX) + fVar25
  ;
  local_c8 = fVar24;
  for (uVar19 = 0; (long)uVar19 < (long)(int)uVar23; uVar19 = uVar19 + 1) {
    if ((table->EnabledMaskByIndex >> (uVar19 & 0x3f) & 1) != 0) {
      pIVar12 = ImSpan<ImGuiTableColumn>::operator[](this_00,(int)uVar19);
      if ((pIVar12->Flags & 4U) != 0) {
        fVar25 = (pIVar12->StretchWeight / local_d0) * fVar24;
        uVar15 = -(uint)(table->MinColumnWidth <= fVar25);
        fVar25 = (float)(int)((float)(~uVar15 & (uint)table->MinColumnWidth | (uint)fVar25 & uVar15)
                             + 0.01);
        pIVar12->WidthRequest = fVar25;
        local_c8 = local_c8 - fVar25;
      }
      if ((pIVar12->NextEnabledColumn == -1) && (table->LeftMostStretchedColumn != -1)) {
        pIVar12->Flags = pIVar12->Flags | 0x40000000;
      }
      uVar15 = -(uint)(table->MinColumnWidth <= pIVar12->WidthRequest);
      fVar25 = (float)(int)(float)(~uVar15 & (uint)table->MinColumnWidth |
                                  (uint)pIVar12->WidthRequest & uVar15);
      pIVar12->WidthGiven = fVar25;
      table->ColumnsGivenWidth = fVar25 + table->ColumnsGivenWidth;
      uVar23 = table->ColumnsCount;
    }
  }
  if (((1.0 <= local_c8) && ((table->Flags & 0x40000) == 0)) && (0.0 < local_d0)) {
    uVar19 = (ulong)uVar23;
    do {
      uVar18 = uVar19 & 0xffffffff;
      do {
        do {
          uVar19 = uVar19 - 1;
          if ((local_c8 < 1.0) || ((int)uVar18 < 1)) goto LAB_00185f18;
          uVar15 = (int)uVar18 - 1;
          uVar18 = (ulong)uVar15;
        } while ((table->EnabledMaskByDisplayOrder >> (uVar19 & 0x3f) & 1) == 0);
        pcVar14 = ImSpan<signed_char>::operator[](this,uVar15);
        pIVar12 = ImSpan<ImGuiTableColumn>::operator[](this_00,(int)*pcVar14);
      } while ((pIVar12->Flags & 4) == 0);
      pIVar12->WidthRequest = pIVar12->WidthRequest + 1.0;
      pIVar12->WidthGiven = pIVar12->WidthGiven + 1.0;
      local_c8 = local_c8 + -1.0;
    } while( true );
  }
LAB_00185f18:
  table->HoveredColumnBody = -1;
  table->HoveredColumnBorder = -1;
  local_40.Max.x = (table->OuterRect).Max.x;
  fVar24 = (table->OuterRect).Max.y;
  local_40.Min = (table->OuterRect).Min;
  fVar25 = local_40.Min.y + table->LastOuterHeight;
  uVar15 = -(uint)(fVar25 <= fVar24);
  local_40.Max.y = (float)(uVar15 & (uint)fVar24 | ~uVar15 & (uint)fVar25);
  iVar21 = 0;
  bVar9 = ItemHoverable(&local_40,0);
  bVar17 = '\0' < table->FreezeColumnsCount;
  fVar24 = fVar27;
  if ('\0' < table->FreezeColumnsCount) {
    fVar24 = (table->OuterRect).Min.x;
  }
  fVar24 = (fVar24 + table->OuterPaddingX) - table->CellSpacingX1;
  host_clip_rect.Min = (table->InnerClipRect).Min;
  host_clip_rect.Max = (table->InnerClipRect).Max;
  table->VisibleMaskByIndex = 0;
  table->RequestOutputMaskByIndex = 0;
  uVar19 = 0;
  do {
    if ((long)table->ColumnsCount <= (long)uVar19) {
      fVar27 = (table->WorkRect).Min.x;
      pIVar12 = ImSpan<ImGuiTableColumn>::operator[](this_00,(int)table->RightMostEnabledColumn);
      fVar24 = (pIVar12->ClipRect).Max.x;
      uVar15 = -(uint)(fVar24 <= fVar27);
      fVar27 = (float)(uVar15 & (uint)fVar27 | ~uVar15 & (uint)fVar24);
      if (((bVar9) && (table->HoveredColumnBody == -1)) && (fVar27 <= (pIVar7->IO).MousePos.x)) {
        table->HoveredColumnBody = (ImGuiTableColumnIdx)table->ColumnsCount;
      }
      if ((!bVar10) && ((table->Flags & 1U) != 0)) {
        table->Flags = table->Flags & 0xfffffffe;
      }
      if (table->RightMostStretchedColumn == -1) {
        if ((table->IsOuterRectMinFitX & 1U) != 0) {
          (table->WorkRect).Max.x = fVar27;
          (table->OuterRect).Max.x = fVar27;
          fVar24 = (table->InnerClipRect).Max.x;
          if (fVar27 <= fVar24) {
            fVar24 = fVar27;
          }
          (table->InnerClipRect).Max.x = fVar24;
        }
      }
      else {
        table->IsOuterRectMinFitX = false;
      }
      pIVar4 = table->InnerWindow;
      IVar6 = (table->WorkRect).Max;
      (pIVar4->ParentWorkRect).Min = (table->WorkRect).Min;
      (pIVar4->ParentWorkRect).Max = IVar6;
      fVar27 = (table->InnerClipRect).Max.x;
      table->BorderX1 = (table->InnerClipRect).Min.x;
      table->BorderX2 = fVar27;
      TableSetupDrawChannels(table);
      if ((table->Flags & 1) != 0) {
        TableUpdateBorders(table);
      }
      table->LastFirstRowHeight = 0.0;
      table->IsLayoutLocked = true;
      table->IsUsingHeaders = false;
      if ((table->IsContextPopupOpen == true) &&
         (table->InstanceCurrent == table->InstanceInteracted)) {
        id = ImHashStr("##ContextMenu",0,table->ID);
        bVar10 = BeginPopupEx(id,0x141);
        if (bVar10) {
          TableDrawContextMenu(table);
          EndPopup();
        }
        else {
          table->IsContextPopupOpen = false;
        }
      }
      uVar15 = table->Flags;
      if (((byte)((uVar15 & 8) >> 3) & table->IsSortSpecsDirty) == 1) {
        TableSortSpecsBuild(table);
        uVar15 = table->Flags;
      }
      pIVar4 = table->InnerWindow;
      if ((uVar15 >> 0x13 & 1) == 0) {
        ImDrawList::PushClipRect
                  (pIVar4->DrawList,(pIVar4->ClipRect).Min,(pIVar4->ClipRect).Max,false);
      }
      else {
        ImDrawListSplitter::SetCurrentChannel(&table->DrawSplitter,pIVar4->DrawList,2);
      }
      return;
    }
    pbVar11 = (byte *)ImSpan<signed_char>::operator[](this,(int)uVar19);
    bVar2 = *pbVar11;
    pIVar12 = ImSpan<ImGuiTableColumn>::operator[](this_00,(int)(char)bVar2);
    bVar22 = true;
    if (table->FreezeRowsCount < '\x01') {
      bVar22 = (char)bVar2 < table->FreezeColumnsCount;
    }
    pIVar12->NavLayerCurrent = bVar22;
    if (bVar17) {
      bVar17 = true;
      if (iVar21 == table->FreezeColumnsCount) {
        fVar24 = fVar24 + (fVar27 - (table->OuterRect).Min.x);
        goto LAB_00186051;
      }
    }
    else {
LAB_00186051:
      bVar17 = false;
    }
    pbVar11 = (byte *)((long)&pIVar12->Flags + 2);
    *pbVar11 = *pbVar11 & 0xf;
    if ((table->EnabledMaskByDisplayOrder >> (uVar19 & 0x3f) & 1) == 0) {
      (pIVar12->ClipRect).Max.x = fVar24;
      (pIVar12->ClipRect).Min.x = fVar24;
      pIVar12->WorkMinX = fVar24;
      pIVar12->MaxX = fVar24;
      pIVar12->MinX = fVar24;
      pIVar12->WidthGiven = 0.0;
      (pIVar12->ClipRect).Min.y = fVar28;
      (pIVar12->ClipRect).Max.y = 3.4028235e+38;
      ImRect::ClipWithFull(&pIVar12->ClipRect,&host_clip_rect);
      pIVar12->IsVisibleX = false;
      pIVar12->IsVisibleY = false;
      pIVar12->IsRequestOutput = false;
      pIVar12->IsSkipItems = true;
      pIVar12->ItemWidth = 1.0;
    }
    else {
      if (((bVar9) && (fVar25 = (pIVar7->IO).MousePos.x, (pIVar12->ClipRect).Min.x <= fVar25)) &&
         (fVar25 < (pIVar12->ClipRect).Max.x)) {
        table->HoveredColumnBody = bVar2;
      }
      pIVar12->MinX = fVar24;
      fVar26 = TableGetMaxColumnWidth(table,(int)(char)bVar2);
      fVar25 = pIVar12->WidthGiven;
      if (fVar26 <= pIVar12->WidthGiven) {
        fVar25 = fVar26;
      }
      fVar26 = pIVar12->WidthRequest;
      if (table->MinColumnWidth <= pIVar12->WidthRequest) {
        fVar26 = table->MinColumnWidth;
      }
      fVar5 = (float)(~-(uint)(fVar26 <= fVar25) & (uint)fVar26 |
                     (uint)fVar25 & -(uint)(fVar26 <= fVar25));
      pIVar12->WidthGiven = fVar5;
      fVar25 = table->CellPaddingX;
      fVar26 = table->CellSpacingX1;
      fVar1 = table->CellSpacingX2;
      fVar29 = fVar25 + fVar25 + fVar5 + fVar24 + fVar26 + fVar1;
      pIVar12->MaxX = fVar29;
      pIVar12->WorkMinX = fVar25 + pIVar12->MinX + fVar26;
      pIVar12->WorkMaxX = (fVar29 - fVar25) - fVar1;
      pIVar12->ItemWidth = (float)(int)(fVar5 * 0.65);
      (pIVar12->ClipRect).Min.x = pIVar12->MinX;
      (pIVar12->ClipRect).Min.y = fVar28;
      (pIVar12->ClipRect).Max.x = fVar29;
      (pIVar12->ClipRect).Max.y = 3.4028235e+38;
      ImRect::ClipWithFull(&pIVar12->ClipRect,&host_clip_rect);
      fVar25 = (pIVar12->ClipRect).Min.x;
      fVar26 = (pIVar12->ClipRect).Max.x;
      pIVar12->IsVisibleX = fVar25 < fVar26;
      pIVar12->IsVisibleY = true;
      if (fVar26 <= fVar25) {
        if (pIVar12->AutoFitQueue != '\0') goto LAB_00186248;
        bVar22 = pIVar12->CannotSkipItemsQueue != '\0';
        pIVar12->IsRequestOutput = bVar22;
        if (bVar22) goto LAB_00186254;
      }
      else {
        table->VisibleMaskByIndex = table->VisibleMaskByIndex | 1L << (bVar2 & 0x3f);
LAB_00186248:
        pIVar12->IsRequestOutput = true;
LAB_00186254:
        table->RequestOutputMaskByIndex = table->RequestOutputMaskByIndex | 1L << (bVar2 & 0x3f);
      }
      bVar22 = true;
      if (pIVar12->IsEnabled == true) {
        bVar22 = table->HostSkipItems;
      }
      pIVar12->IsSkipItems = bVar22;
      if (bVar22 == true && fVar25 < fVar26) {
        __assert_fail("!is_visible",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_tables.cpp"
                      ,0x3d5,"void ImGui::TableUpdateLayout(ImGuiTable *)");
      }
      uVar15 = (uint)(fVar25 < fVar26) << 0x15 | pIVar12->Flags;
      uVar23 = uVar15 | 0x100000;
      pIVar12->Flags = uVar23;
      if (pIVar12->SortOrder != -1) {
        uVar23 = uVar15 | 0x500000;
        pIVar12->Flags = uVar23;
      }
      if (table->HoveredColumnBody == bVar2) {
        pIVar12->Flags = uVar23 | 0x800000;
      }
      fVar25 = pIVar12->WorkMinX;
      pIVar12->ContentMaxXFrozen = fVar25;
      pIVar12->ContentMaxXUnfrozen = fVar25;
      pIVar12->ContentMaxXHeadersUsed = fVar25;
      pIVar12->ContentMaxXHeadersIdeal = fVar25;
      if (table->HostSkipItems == false) {
        pIVar12->AutoFitQueue = pIVar12->AutoFitQueue >> 1;
        pIVar12->CannotSkipItemsQueue = pIVar12->CannotSkipItemsQueue >> 1;
      }
      if (iVar21 < table->FreezeColumnsCount) {
        fVar26 = pIVar12->MaxX + 1.0;
        fVar25 = host_clip_rect.Max.x;
        if (fVar26 <= host_clip_rect.Max.x) {
          fVar25 = fVar26;
        }
        host_clip_rect.Min.x =
             (float)(-(uint)(fVar26 < host_clip_rect.Min.x) & (uint)host_clip_rect.Min.x |
                    ~-(uint)(fVar26 < host_clip_rect.Min.x) & (uint)fVar25);
      }
      fVar24 = fVar24 + table->CellPaddingX + table->CellPaddingX +
                        pIVar12->WidthGiven + table->CellSpacingX1 + table->CellSpacingX2;
      iVar21 = iVar21 + 1;
    }
    uVar19 = uVar19 + 1;
  } while( true );
}

Assistant:

void ImGui::TableUpdateLayout(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(table->IsLayoutLocked == false);

    const ImGuiTableFlags table_sizing_policy = (table->Flags & ImGuiTableFlags_SizingMask_);
    table->IsDefaultDisplayOrder = true;
    table->ColumnsEnabledCount = 0;
    table->EnabledMaskByIndex = 0x00;
    table->EnabledMaskByDisplayOrder = 0x00;
    table->MinColumnWidth = ImMax(1.0f, g.Style.FramePadding.x * 1.0f); // g.Style.ColumnsMinSpacing; // FIXME-TABLE

    // [Part 1] Apply/lock Enabled and Order states. Calculate auto/ideal width for columns. Count fixed/stretch columns.
    // Process columns in their visible orders as we are building the Prev/Next indices.
    int count_fixed = 0;                // Number of columns that have fixed sizing policies
    int count_stretch = 0;              // Number of columns that have stretch sizing policies
    int last_visible_column_idx = -1;
    bool has_auto_fit_request = false;
    bool has_resizable = false;
    float stretch_sum_width_auto = 0.0f;
    float fixed_max_width_auto = 0.0f;
    for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
    {
        const int column_n = table->DisplayOrderToIndex[order_n];
        if (column_n != order_n)
            table->IsDefaultDisplayOrder = false;
        ImGuiTableColumn* column = &table->Columns[column_n];

        // Clear column setup if not submitted by user. Currently we make it mandatory to call TableSetupColumn() every frame.
        // It would easily work without but we're not ready to guarantee it since e.g. names need resubmission anyway.
        // We take a slight shortcut but in theory we could be calling TableSetupColumn() here with dummy values, it should yield the same effect.
        if (table->DeclColumnsCount <= column_n)
        {
            TableSetupColumnFlags(table, column, ImGuiTableColumnFlags_None);
            column->NameOffset = -1;
            column->UserID = 0;
            column->InitStretchWeightOrWidth = -1.0f;
        }

        // Update Enabled state, mark settings/sortspecs dirty
        if (!(table->Flags & ImGuiTableFlags_Hideable) || (column->Flags & ImGuiTableColumnFlags_NoHide))
            column->IsEnabledNextFrame = true;
        if (column->IsEnabled != column->IsEnabledNextFrame)
        {
            column->IsEnabled = column->IsEnabledNextFrame;
            table->IsSettingsDirty = true;
            if (!column->IsEnabled && column->SortOrder != -1)
                table->IsSortSpecsDirty = true;
        }
        if (column->SortOrder > 0 && !(table->Flags & ImGuiTableFlags_SortMulti))
            table->IsSortSpecsDirty = true;

        // Auto-fit unsized columns
        const bool start_auto_fit = (column->Flags & ImGuiTableColumnFlags_WidthFixed) ? (column->WidthRequest < 0.0f) : (column->StretchWeight < 0.0f);
        if (start_auto_fit)
            column->AutoFitQueue = column->CannotSkipItemsQueue = (1 << 3) - 1; // Fit for three frames

        if (!column->IsEnabled)
        {
            column->IndexWithinEnabledSet = -1;
            continue;
        }

        // Mark as enabled and link to previous/next enabled column
        column->PrevEnabledColumn = (ImGuiTableColumnIdx)last_visible_column_idx;
        column->NextEnabledColumn = -1;
        if (last_visible_column_idx != -1)
            table->Columns[last_visible_column_idx].NextEnabledColumn = (ImGuiTableColumnIdx)column_n;
        column->IndexWithinEnabledSet = table->ColumnsEnabledCount++;
        table->EnabledMaskByIndex |= (ImU64)1 << column_n;
        table->EnabledMaskByDisplayOrder |= (ImU64)1 << column->DisplayOrder;
        last_visible_column_idx = column_n;
        IM_ASSERT(column->IndexWithinEnabledSet <= column->DisplayOrder);

        // Calculate ideal/auto column width (that's the width required for all contents to be visible without clipping)
        // Combine width from regular rows + width from headers unless requested not to.
        if (!column->IsPreserveWidthAuto)
            column->WidthAuto = TableGetColumnWidthAuto(table, column);

        // Non-resizable columns keep their requested width (apply user value regardless of IsPreserveWidthAuto)
        const bool column_is_resizable = (column->Flags & ImGuiTableColumnFlags_NoResize) == 0;
        if (column_is_resizable)
            has_resizable = true;
        if ((column->Flags & ImGuiTableColumnFlags_WidthFixed) && column->InitStretchWeightOrWidth > 0.0f && !column_is_resizable)
            column->WidthAuto = column->InitStretchWeightOrWidth;

        if (column->AutoFitQueue != 0x00)
            has_auto_fit_request = true;
        if (column->Flags & ImGuiTableColumnFlags_WidthStretch)
        {
            stretch_sum_width_auto += column->WidthAuto;
            count_stretch++;
        }
        else
        {
            fixed_max_width_auto = ImMax(fixed_max_width_auto, column->WidthAuto);
            count_fixed++;
        }
    }
    if ((table->Flags & ImGuiTableFlags_Sortable) && table->SortSpecsCount == 0 && !(table->Flags & ImGuiTableFlags_SortTristate))
        table->IsSortSpecsDirty = true;
    table->RightMostEnabledColumn = (ImGuiTableColumnIdx)last_visible_column_idx;
    IM_ASSERT(table->RightMostEnabledColumn >= 0);

    // [Part 2] Disable child window clipping while fitting columns. This is not strictly necessary but makes it possible
    // to avoid the column fitting having to wait until the first visible frame of the child container (may or not be a good thing).
    // FIXME-TABLE: for always auto-resizing columns may not want to do that all the time.
    if (has_auto_fit_request && table->OuterWindow != table->InnerWindow)
        table->InnerWindow->SkipItems = false;
    if (has_auto_fit_request)
        table->IsSettingsDirty = true;

    // [Part 3] Fix column flags and record a few extra information.
    float sum_width_requests = 0.0f;        // Sum of all width for fixed and auto-resize columns, excluding width contributed by Stretch columns but including spacing/padding.
    float stretch_sum_weights = 0.0f;       // Sum of all weights for stretch columns.
    table->LeftMostStretchedColumn = table->RightMostStretchedColumn = -1;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        if (!(table->EnabledMaskByIndex & ((ImU64)1 << column_n)))
            continue;
        ImGuiTableColumn* column = &table->Columns[column_n];

        const bool column_is_resizable = (column->Flags & ImGuiTableColumnFlags_NoResize) == 0;
        if (column->Flags & ImGuiTableColumnFlags_WidthFixed)
        {
            // Apply same widths policy
            float width_auto = column->WidthAuto;
            if (table_sizing_policy == ImGuiTableFlags_SizingFixedSame && (column->AutoFitQueue != 0x00 || !column_is_resizable))
                width_auto = fixed_max_width_auto; 

            // Apply automatic width
            // Latch initial size for fixed columns and update it constantly for auto-resizing column (unless clipped!)
            if (column->AutoFitQueue != 0x00)
                column->WidthRequest = width_auto;
            else if ((column->Flags & ImGuiTableColumnFlags_WidthFixed) && !column_is_resizable && (table->RequestOutputMaskByIndex & ((ImU64)1 << column_n)))
                column->WidthRequest = width_auto;

            // FIXME-TABLE: Increase minimum size during init frame to avoid biasing auto-fitting widgets
            // (e.g. TextWrapped) too much. Otherwise what tends to happen is that TextWrapped would output a very
            // large height (= first frame scrollbar display very off + clipper would skip lots of items).
            // This is merely making the side-effect less extreme, but doesn't properly fixes it.
            // FIXME: Move this to ->WidthGiven to avoid temporary lossyless?
            // FIXME: This break IsPreserveWidthAuto from not flickering if the stored WidthAuto was smaller.
            if (column->AutoFitQueue > 0x01 && table->IsInitializing && !column->IsPreserveWidthAuto)
                column->WidthRequest = ImMax(column->WidthRequest, table->MinColumnWidth * 4.0f); // FIXME-TABLE: Another constant/scale?
            sum_width_requests += column->WidthRequest;
        }
        else
        {
            // Initialize stretch weight
            if (column->AutoFitQueue != 0x00 || column->StretchWeight < 0.0f || !column_is_resizable)
            {
                if (column->InitStretchWeightOrWidth > 0.0f)
                    column->StretchWeight = column->InitStretchWeightOrWidth;
                else if (table_sizing_policy == ImGuiTableFlags_SizingStretchProp)
                    column->StretchWeight = (column->WidthAuto / stretch_sum_width_auto) * count_stretch;
                else
                    column->StretchWeight = 1.0f;
            }

            stretch_sum_weights += column->StretchWeight;
            if (table->LeftMostStretchedColumn == -1 || table->Columns[table->LeftMostStretchedColumn].DisplayOrder > column->DisplayOrder)
                table->LeftMostStretchedColumn = (ImGuiTableColumnIdx)column_n;
            if (table->RightMostStretchedColumn == -1 || table->Columns[table->RightMostStretchedColumn].DisplayOrder < column->DisplayOrder)
                table->RightMostStretchedColumn = (ImGuiTableColumnIdx)column_n;
        }
        column->IsPreserveWidthAuto = false;
        sum_width_requests += table->CellPaddingX * 2.0f;
    }
    table->ColumnsEnabledFixedCount = (ImGuiTableColumnIdx)count_fixed;

    // [Part 4] Apply final widths based on requested widths
    const ImRect work_rect = table->WorkRect;
    const float width_spacings = (table->OuterPaddingX * 2.0f) + (table->CellSpacingX1 + table->CellSpacingX2) * (table->ColumnsEnabledCount - 1);
    const float width_avail = ((table->Flags & ImGuiTableFlags_ScrollX) && table->InnerWidth == 0.0f) ? table->InnerClipRect.GetWidth() : work_rect.GetWidth();
    const float width_avail_for_stretched_columns = width_avail - width_spacings - sum_width_requests;
    float width_remaining_for_stretched_columns = width_avail_for_stretched_columns;
    table->ColumnsGivenWidth = width_spacings + (table->CellPaddingX * 2.0f) * table->ColumnsEnabledCount;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        if (!(table->EnabledMaskByIndex & ((ImU64)1 << column_n)))
            continue;
        ImGuiTableColumn* column = &table->Columns[column_n];

        // Allocate width for stretched/weighted columns (StretchWeight gets converted into WidthRequest)
        if (column->Flags & ImGuiTableColumnFlags_WidthStretch)
        {
            float weight_ratio = column->StretchWeight / stretch_sum_weights;
            column->WidthRequest = IM_FLOOR(ImMax(width_avail_for_stretched_columns * weight_ratio, table->MinColumnWidth) + 0.01f);
            width_remaining_for_stretched_columns -= column->WidthRequest;
        }

        // [Resize Rule 1] The right-most Visible column is not resizable if there is at least one Stretch column
        // See additional comments in TableSetColumnWidth().
        if (column->NextEnabledColumn == -1 && table->LeftMostStretchedColumn != -1)
            column->Flags |= ImGuiTableColumnFlags_NoDirectResize_;

        // Assign final width, record width in case we will need to shrink
        column->WidthGiven = ImFloor(ImMax(column->WidthRequest, table->MinColumnWidth));
        table->ColumnsGivenWidth += column->WidthGiven;
    }

    // [Part 5] Redistribute stretch remainder width due to rounding (remainder width is < 1.0f * number of Stretch column).
    // Using right-to-left distribution (more likely to match resizing cursor).
    if (width_remaining_for_stretched_columns >= 1.0f && !(table->Flags & ImGuiTableFlags_PreciseWidths))
        for (int order_n = table->ColumnsCount - 1; stretch_sum_weights > 0.0f && width_remaining_for_stretched_columns >= 1.0f && order_n >= 0; order_n--)
        {
            if (!(table->EnabledMaskByDisplayOrder & ((ImU64)1 << order_n)))
                continue;
            ImGuiTableColumn* column = &table->Columns[table->DisplayOrderToIndex[order_n]];
            if (!(column->Flags & ImGuiTableColumnFlags_WidthStretch))
                continue;
            column->WidthRequest += 1.0f;
            column->WidthGiven += 1.0f;
            width_remaining_for_stretched_columns -= 1.0f;
        }

    table->HoveredColumnBody = -1;
    table->HoveredColumnBorder = -1;
    const ImRect mouse_hit_rect(table->OuterRect.Min.x, table->OuterRect.Min.y, table->OuterRect.Max.x, ImMax(table->OuterRect.Max.y, table->OuterRect.Min.y + table->LastOuterHeight));
    const bool is_hovering_table = ItemHoverable(mouse_hit_rect, 0);

    // [Part 6] Setup final position, offset, skip/clip states and clipping rectangles, detect hovered column
    // Process columns in their visible orders as we are comparing the visible order and adjusting host_clip_rect while looping.
    int visible_n = 0;
    bool offset_x_frozen = (table->FreezeColumnsCount > 0);
    float offset_x = ((table->FreezeColumnsCount > 0) ? table->OuterRect.Min.x : work_rect.Min.x) + table->OuterPaddingX - table->CellSpacingX1;
    ImRect host_clip_rect = table->InnerClipRect;
    //host_clip_rect.Max.x += table->CellPaddingX + table->CellSpacingX2;
    table->VisibleMaskByIndex = 0x00;
    table->RequestOutputMaskByIndex = 0x00;
    for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
    {
        const int column_n = table->DisplayOrderToIndex[order_n];
        ImGuiTableColumn* column = &table->Columns[column_n];

        column->NavLayerCurrent = (ImS8)((table->FreezeRowsCount > 0 || column_n < table->FreezeColumnsCount) ? ImGuiNavLayer_Menu : ImGuiNavLayer_Main);

        if (offset_x_frozen && table->FreezeColumnsCount == visible_n)
        {
            offset_x += work_rect.Min.x - table->OuterRect.Min.x;
            offset_x_frozen = false;
        }

        // Clear status flags
        column->Flags &= ~ImGuiTableColumnFlags_StatusMask_;

        if ((table->EnabledMaskByDisplayOrder & ((ImU64)1 << order_n)) == 0)
        {
            // Hidden column: clear a few fields and we are done with it for the remainder of the function.
            // We set a zero-width clip rect but set Min.y/Max.y properly to not interfere with the clipper.
            column->MinX = column->MaxX = column->WorkMinX = column->ClipRect.Min.x = column->ClipRect.Max.x = offset_x;
            column->WidthGiven = 0.0f;
            column->ClipRect.Min.y = work_rect.Min.y;
            column->ClipRect.Max.y = FLT_MAX;
            column->ClipRect.ClipWithFull(host_clip_rect);
            column->IsVisibleX = column->IsVisibleY = column->IsRequestOutput = false;
            column->IsSkipItems = true;
            column->ItemWidth = 1.0f;
            continue;
        }

        // Detect hovered column
        if (is_hovering_table && g.IO.MousePos.x >= column->ClipRect.Min.x && g.IO.MousePos.x < column->ClipRect.Max.x)
            table->HoveredColumnBody = (ImGuiTableColumnIdx)column_n;

        // Lock start position
        column->MinX = offset_x;

        // Lock width based on start position and minimum/maximum width for this position
        float max_width = TableGetMaxColumnWidth(table, column_n);
        column->WidthGiven = ImMin(column->WidthGiven, max_width);
        column->WidthGiven = ImMax(column->WidthGiven, ImMin(column->WidthRequest, table->MinColumnWidth));
        column->MaxX = offset_x + column->WidthGiven + table->CellSpacingX1 + table->CellSpacingX2 + table->CellPaddingX * 2.0f;

        // Lock other positions
        // - ClipRect.Min.x: Because merging draw commands doesn't compare min boundaries, we make ClipRect.Min.x match left bounds to be consistent regardless of merging.
        // - ClipRect.Max.x: using WorkMaxX instead of MaxX (aka including padding) makes things more consistent when resizing down, tho slightly detrimental to visibility in very-small column.
        // - ClipRect.Max.x: using MaxX makes it easier for header to receive hover highlight with no discontinuity and display sorting arrow.
        // - FIXME-TABLE: We want equal width columns to have equal (ClipRect.Max.x - WorkMinX) width, which means ClipRect.max.x cannot stray off host_clip_rect.Max.x else right-most column may appear shorter.
        column->WorkMinX = column->MinX + table->CellPaddingX + table->CellSpacingX1;
        column->WorkMaxX = column->MaxX - table->CellPaddingX - table->CellSpacingX2; // Expected max
        column->ItemWidth = ImFloor(column->WidthGiven * 0.65f);
        column->ClipRect.Min.x = column->MinX;
        column->ClipRect.Min.y = work_rect.Min.y;
        column->ClipRect.Max.x = column->MaxX; //column->WorkMaxX;
        column->ClipRect.Max.y = FLT_MAX;
        column->ClipRect.ClipWithFull(host_clip_rect);

        // Mark column as Clipped (not in sight)
        // Note that scrolling tables (where inner_window != outer_window) handle Y clipped earlier in BeginTable() so IsVisibleY really only applies to non-scrolling tables.
        // FIXME-TABLE: Because InnerClipRect.Max.y is conservatively ==outer_window->ClipRect.Max.y, we never can mark columns _Above_ the scroll line as not IsVisibleY.
        // Taking advantage of LastOuterHeight would yield good results there...
        // FIXME-TABLE: Y clipping is disabled because it effectively means not submitting will reduce contents width which is fed to outer_window->DC.CursorMaxPos.x,
        // and this may be used (e.g. typically by outer_window using AlwaysAutoResize or outer_window's horizontal scrollbar, but could be something else).
        // Possible solution to preserve last known content width for clipped column. Test 'table_reported_size' fails when enabling Y clipping and window is resized small.
        column->IsVisibleX = (column->ClipRect.Max.x > column->ClipRect.Min.x);
        column->IsVisibleY = true; // (column->ClipRect.Max.y > column->ClipRect.Min.y);
        const bool is_visible = column->IsVisibleX; //&& column->IsVisibleY;
        if (is_visible)
            table->VisibleMaskByIndex |= ((ImU64)1 << column_n);

        // Mark column as requesting output from user. Note that fixed + non-resizable sets are auto-fitting at all times and therefore always request output.
        column->IsRequestOutput = is_visible || column->AutoFitQueue != 0 || column->CannotSkipItemsQueue != 0;
        if (column->IsRequestOutput)
            table->RequestOutputMaskByIndex |= ((ImU64)1 << column_n);

        // Mark column as SkipItems (ignoring all items/layout)
        column->IsSkipItems = !column->IsEnabled || table->HostSkipItems;
        if (column->IsSkipItems)
            IM_ASSERT(!is_visible);

        // Update status flags
        column->Flags |= ImGuiTableColumnFlags_IsEnabled;
        if (is_visible)
            column->Flags |= ImGuiTableColumnFlags_IsVisible;
        if (column->SortOrder != -1)
            column->Flags |= ImGuiTableColumnFlags_IsSorted;
        if (table->HoveredColumnBody == column_n)
            column->Flags |= ImGuiTableColumnFlags_IsHovered;

        // Alignment
        // FIXME-TABLE: This align based on the whole column width, not per-cell, and therefore isn't useful in
        // many cases (to be able to honor this we might be able to store a log of cells width, per row, for
        // visible rows, but nav/programmatic scroll would have visible artifacts.)
        //if (column->Flags & ImGuiTableColumnFlags_AlignRight)
        //    column->WorkMinX = ImMax(column->WorkMinX, column->MaxX - column->ContentWidthRowsUnfrozen);
        //else if (column->Flags & ImGuiTableColumnFlags_AlignCenter)
        //    column->WorkMinX = ImLerp(column->WorkMinX, ImMax(column->StartX, column->MaxX - column->ContentWidthRowsUnfrozen), 0.5f);

        // Reset content width variables
        column->ContentMaxXFrozen = column->ContentMaxXUnfrozen = column->WorkMinX;
        column->ContentMaxXHeadersUsed = column->ContentMaxXHeadersIdeal = column->WorkMinX;

        // Don't decrement auto-fit counters until container window got a chance to submit its items
        if (table->HostSkipItems == false)
        {
            column->AutoFitQueue >>= 1;
            column->CannotSkipItemsQueue >>= 1;
        }

        if (visible_n < table->FreezeColumnsCount)
            host_clip_rect.Min.x = ImClamp(column->MaxX + TABLE_BORDER_SIZE, host_clip_rect.Min.x, host_clip_rect.Max.x);

        offset_x += column->WidthGiven + table->CellSpacingX1 + table->CellSpacingX2 + table->CellPaddingX * 2.0f;
        visible_n++;
    }

    // [Part 7] Detect/store when we are hovering the unused space after the right-most column (so e.g. context menus can react on it)
    // Clear Resizable flag if none of our column are actually resizable (either via an explicit _NoResize flag, either
    // because of using _WidthAuto/_WidthStretch). This will hide the resizing option from the context menu.
    const float unused_x1 = ImMax(table->WorkRect.Min.x, table->Columns[table->RightMostEnabledColumn].ClipRect.Max.x);
    if (is_hovering_table && table->HoveredColumnBody == -1)
    {
        if (g.IO.MousePos.x >= unused_x1)
            table->HoveredColumnBody = (ImGuiTableColumnIdx)table->ColumnsCount;
    }
    if (has_resizable == false && (table->Flags & ImGuiTableFlags_Resizable))
        table->Flags &= ~ImGuiTableFlags_Resizable;

    // [Part 8] Lock actual OuterRect/WorkRect right-most position.
    // This is done late to handle the case of fixed-columns tables not claiming more widths that they need.
    // Because of this we are careful with uses of WorkRect and InnerClipRect before this point.
    if (table->RightMostStretchedColumn != -1)
        table->IsOuterRectMinFitX = false;
    if (table->IsOuterRectMinFitX)
    {
        table->OuterRect.Max.x = table->WorkRect.Max.x = unused_x1;
        table->InnerClipRect.Max.x = ImMin(table->InnerClipRect.Max.x, unused_x1);
    }
    table->InnerWindow->ParentWorkRect = table->WorkRect;
    table->BorderX1 = table->InnerClipRect.Min.x;// +((table->Flags & ImGuiTableFlags_BordersOuter) ? 0.0f : -1.0f);
    table->BorderX2 = table->InnerClipRect.Max.x;// +((table->Flags & ImGuiTableFlags_BordersOuter) ? 0.0f : +1.0f);

    // [Part 9] Allocate draw channels and setup background cliprect
    TableSetupDrawChannels(table);

    // [Part 10] Hit testing on borders
    if (table->Flags & ImGuiTableFlags_Resizable)
        TableUpdateBorders(table);
    table->LastFirstRowHeight = 0.0f;
    table->IsLayoutLocked = true;
    table->IsUsingHeaders = false;

    // [Part 11] Context menu
    if (table->IsContextPopupOpen && table->InstanceCurrent == table->InstanceInteracted)
    {
        const ImGuiID context_menu_id = ImHashStr("##ContextMenu", 0, table->ID);
        if (BeginPopupEx(context_menu_id, ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoSavedSettings))
        {
            TableDrawContextMenu(table);
            EndPopup();
        }
        else
        {
            table->IsContextPopupOpen = false;
        }
    }

    // [Part 13] Sanitize and build sort specs before we have a change to use them for display.
    // This path will only be exercised when sort specs are modified before header rows (e.g. init or visibility change)
    if (table->IsSortSpecsDirty && (table->Flags & ImGuiTableFlags_Sortable))
        TableSortSpecsBuild(table);

    // Initial state
    ImGuiWindow* inner_window = table->InnerWindow;
    if (table->Flags & ImGuiTableFlags_NoClip)
        table->DrawSplitter.SetCurrentChannel(inner_window->DrawList, TABLE_DRAW_CHANNEL_NOCLIP);
    else
        inner_window->DrawList->PushClipRect(inner_window->ClipRect.Min, inner_window->ClipRect.Max, false);
}